

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

uint llvm::dwarf::TagVersion(Tag Tag)

{
  uint uVar1;
  
  uVar1 = 0;
  if (Tag < (DW_TAG_call_site|DW_TAG_enumeration_type)) {
    uVar1 = *(uint *)(&DAT_00e75100 + (ulong)Tag * 4);
  }
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::TagVersion(dwarf::Tag Tag) {
  switch (Tag) {
  default:
    return 0;
#define HANDLE_DW_TAG(ID, NAME, VERSION, VENDOR, KIND)                         \
  case DW_TAG_##NAME:                                                          \
    return VERSION;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}